

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easy.c
# Opt level: O0

CURLcode curl_global_init_mem
                   (long flags,curl_malloc_callback m,curl_free_callback f,curl_realloc_callback r,
                   curl_strdup_callback s,curl_calloc_callback c)

{
  CURLcode result;
  curl_calloc_callback c_local;
  curl_strdup_callback s_local;
  curl_realloc_callback r_local;
  curl_free_callback f_local;
  curl_malloc_callback m_local;
  long flags_local;
  
  if ((((m == (curl_malloc_callback)0x0) || (f == (curl_free_callback)0x0)) ||
      (r == (curl_realloc_callback)0x0)) ||
     ((s == (curl_strdup_callback)0x0 || (c == (curl_calloc_callback)0x0)))) {
    flags_local._4_4_ = CURLE_FAILED_INIT;
  }
  else {
    curl_simple_lock_lock(&s_lock);
    if (initialized == 0) {
      Curl_cmalloc = m;
      Curl_cfree = f;
      Curl_crealloc = r;
      Curl_cstrdup = s;
      Curl_ccalloc = c;
      flags_local._4_4_ = global_init(flags,false);
      curl_simple_lock_unlock(&s_lock);
    }
    else {
      initialized = initialized + 1;
      curl_simple_lock_unlock(&s_lock);
      flags_local._4_4_ = CURLE_OK;
    }
  }
  return flags_local._4_4_;
}

Assistant:

CURLcode curl_global_init_mem(long flags, curl_malloc_callback m,
                              curl_free_callback f, curl_realloc_callback r,
                              curl_strdup_callback s, curl_calloc_callback c)
{
  CURLcode result;

  /* Invalid input, return immediately */
  if(!m || !f || !r || !s || !c)
    return CURLE_FAILED_INIT;

  global_init_lock();

  if(initialized) {
    /* Already initialized, do not do it again, but bump the variable anyway to
       work like curl_global_init() and require the same amount of cleanup
       calls. */
    initialized++;
    global_init_unlock();
    return CURLE_OK;
  }

  /* set memory functions before global_init() in case it wants memory
     functions */
  Curl_cmalloc = m;
  Curl_cfree = f;
  Curl_cstrdup = s;
  Curl_crealloc = r;
  Curl_ccalloc = c;

  /* Call the actual init function, but without setting */
  result = global_init(flags, FALSE);

  global_init_unlock();

  return result;
}